

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O3

Cdr * __thiscall eprosima::fastcdr::Cdr::serialize(Cdr *this,float float_t)

{
  bool bVar1;
  char *pcVar2;
  float *pfVar3;
  NotEnoughMemoryException *this_00;
  ulong uVar4;
  
  pcVar2 = (this->m_currentPosition).m_currentPosition;
  uVar4 = 0;
  if (this->m_lastDataSize < 4) {
    uVar4 = (ulong)(*(int *)&(this->m_alignPosition).m_currentPosition - (int)pcVar2 & 3);
  }
  if ((ulong)((long)(this->m_lastPosition).m_currentPosition - (long)pcVar2) < uVar4 + 4) {
    bVar1 = resize(this,uVar4 + 4);
    if (!bVar1) {
      this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
      exception::NotEnoughMemoryException::NotEnoughMemoryException
                (this_00,&exception::NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
      __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
                  exception::NotEnoughMemoryException::~NotEnoughMemoryException);
    }
    pcVar2 = (this->m_currentPosition).m_currentPosition;
  }
  this->m_lastDataSize = 4;
  pfVar3 = (float *)(pcVar2 + uVar4);
  (this->m_currentPosition).m_currentPosition = (char *)pfVar3;
  if (this->m_swapBytes == true) {
    (this->m_currentPosition).m_currentPosition = (char *)((long)pfVar3 + 1);
    *(char *)pfVar3 = (char)((uint)float_t >> 0x18);
    pcVar2 = (this->m_currentPosition).m_currentPosition;
    (this->m_currentPosition).m_currentPosition = pcVar2 + 1;
    *pcVar2 = (char)((uint)float_t >> 0x10);
    pcVar2 = (this->m_currentPosition).m_currentPosition;
    (this->m_currentPosition).m_currentPosition = pcVar2 + 1;
    *pcVar2 = (char)((uint)float_t >> 8);
    pcVar2 = (this->m_currentPosition).m_currentPosition;
    (this->m_currentPosition).m_currentPosition = pcVar2 + 1;
    *pcVar2 = SUB41(float_t,0);
  }
  else {
    *pfVar3 = float_t;
    (this->m_currentPosition).m_currentPosition = (char *)(pfVar3 + 1);
  }
  return this;
}

Assistant:

Cdr& Cdr::serialize(const float float_t)
{
    size_t align = alignment(sizeof(float_t));
    size_t sizeAligned = sizeof(float_t) + align;

    if(((m_lastPosition - m_currentPosition) >= sizeAligned) || resize(sizeAligned))
    {
        // Save last datasize.
        m_lastDataSize = sizeof(float_t);

        // Align.
        makeAlign(align);

        if(m_swapBytes)
        {
            const char *dst = reinterpret_cast<const char*>(&float_t);

            m_currentPosition++ << dst[3];
            m_currentPosition++ << dst[2];
            m_currentPosition++ << dst[1];
            m_currentPosition++ << dst[0];
        }
        else
        {
            m_currentPosition << float_t;
            m_currentPosition += sizeof(float_t);
        }

        return *this;
    }

    throw NotEnoughMemoryException(NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
}